

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScalableKReach.cpp
# Opt level: O1

bool __thiscall
ScalableKReach::PartialIndex::double_intermediate(PartialIndex *this,vertex_t s,vertex_t t)

{
  byte bVar1;
  byte bVar2;
  pointer puVar3;
  mapped_type *pmVar4;
  __node_base *p_Var5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  bool local_61;
  _Hash_node_base *local_60;
  
  local_60 = (this->succ_)._M_h._M_before_begin._M_nxt;
  local_61 = local_60 != (_Hash_node_base *)0x0;
  if (local_61) {
    uVar7 = (ulong)s;
    uVar8 = (ulong)t;
    do {
      p_Var5 = &(this->succ_)._M_h._M_before_begin;
      do {
        p_Var5 = p_Var5->_M_nxt;
        if (p_Var5 == (__node_base *)0x0) goto LAB_00108aa3;
        pmVar4 = std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       *)&this->pred_,(key_type *)(local_60 + 1));
        puVar3 = (pmVar4->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                 .super__Vector_impl_data._M_start;
        uVar6 = uVar7;
        if ((ulong)((long)(pmVar4->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)puVar3) <= uVar7) {
LAB_00108af2:
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar6);
        }
        bVar1 = puVar3[uVar7];
        pmVar4 = std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       *)&this->succ_,(key_type *)(local_60 + 1));
        uVar6 = (ulong)(uint)*(size_type *)(p_Var5 + 1);
        puVar3 = (pmVar4->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                 .super__Vector_impl_data._M_start;
        if ((ulong)((long)(pmVar4->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)puVar3) <= uVar6)
        goto LAB_00108af2;
        bVar2 = puVar3[uVar6];
        pmVar4 = std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       *)&this->succ_,(key_type *)(p_Var5 + 1));
        puVar3 = (pmVar4->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                 .super__Vector_impl_data._M_start;
        uVar6 = uVar8;
        if ((ulong)((long)(pmVar4->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)puVar3) <= uVar8)
        goto LAB_00108af2;
      } while ((uint)this->k_ < (uint)puVar3[uVar8] + (uint)bVar2 + (uint)bVar1);
      if (p_Var5 != (__node_base *)0x0) {
        return local_61;
      }
LAB_00108aa3:
      local_60 = local_60->_M_nxt;
      local_61 = local_60 != (_Hash_node_base *)0x0;
    } while (local_61);
  }
  return local_61;
}

Assistant:

bool ScalableKReach::PartialIndex::double_intermediate(vertex_t s, vertex_t t) const {
    for (const auto &i : succ_) {
        for (const auto &j : succ_) {
            if (pred_.at(i.first).at(s) + succ_.at(i.first).at(j.first) + succ_.at(j.first).at(t) <= k_) {
                return true;
            }
        }
    }
    return false;
}